

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O2

UBool CReg::unreg(UCurrRegistryKey key)

{
  CReg *pCVar1;
  CReg *pCVar2;
  UBool UVar3;
  void *in_RSI;
  
  umtx_lock_63(&gCRegLock);
  pCVar1 = (CReg *)&gCRegHead;
  do {
    pCVar2 = pCVar1;
    pCVar1 = pCVar2->next;
    if (pCVar1 == (CReg *)0x0) {
      UVar3 = '\0';
      goto LAB_002bdbdb;
    }
  } while (pCVar1 != (CReg *)key);
  pCVar2->next = *key;
  icu_63::UMemory::operator_delete((UMemory *)key,in_RSI);
  UVar3 = '\x01';
LAB_002bdbdb:
  umtx_unlock_63(&gCRegLock);
  return UVar3;
}

Assistant:

static UBool unreg(UCurrRegistryKey key) {
        UBool found = FALSE;
        umtx_lock(&gCRegLock);

        CReg** p = &gCRegHead;
        while (*p) {
            if (*p == key) {
                *p = ((CReg*)key)->next;
                delete (CReg*)key;
                found = TRUE;
                break;
            }
            p = &((*p)->next);
        }

        umtx_unlock(&gCRegLock);
        return found;
    }